

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O3

void __thiscall docopt::BranchPattern::fix_repeating_arguments(BranchPattern *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar1;
  undefined8 uVar2;
  pointer pvVar3;
  Kind KVar4;
  ulong uVar5;
  long lVar6;
  size_type sVar7;
  LeafPattern *this_01;
  pointer pbVar8;
  iterator __position;
  undefined8 *puVar9;
  __node_base _Var10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  element_type *peVar11;
  pointer pvVar12;
  long lVar13;
  initializer_list<std::shared_ptr<docopt::Pattern>_> __l;
  PatternList group;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  groups;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  either;
  allocator_type local_149;
  undefined1 local_148 [8];
  undefined1 auStack_140 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  _Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
  local_d8;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _func_int **local_58;
  pointer local_50;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_48;
  
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector(&local_48,&this->fChildren);
  local_98.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_buckets = (__buckets_ptr)0x0;
  local_d8._M_bucket_count = 0;
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
  ::
  emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
            ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
              *)&local_d8,&local_48);
  if (local_d8._M_buckets != (__buckets_ptr)local_d8._M_bucket_count) {
    do {
      local_148 = (undefined1  [8])
                  (((_Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)local_d8._M_buckets)->_M_impl).super__Vector_impl_data._M_start;
      auStack_140._0_8_ =
           (((_Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              *)local_d8._M_buckets)->_M_impl).super__Vector_impl_data._M_finish;
      auStack_140._8_8_ =
           (((_Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              *)local_d8._M_buckets)->_M_impl).super__Vector_impl_data._M_end_of_storage;
      (((_Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         *)local_d8._M_buckets)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
      (((_Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         *)local_d8._M_buckets)->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
      (((_Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         *)local_d8._M_buckets)->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ::_M_erase((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                  *)&local_d8,(iterator)local_d8._M_buckets);
      uVar2 = auStack_140._0_8_;
      uVar5 = auStack_140._0_8_ - (long)local_148;
      __position._M_current = (shared_ptr<docopt::Pattern> *)local_148;
      if (0 < (long)uVar5 >> 6) {
        pbVar8 = (pointer)((long)&((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)
                                  local_148)->_M_ptr + (uVar5 & 0xffffffffffffffc0));
        lVar13 = ((long)uVar5 >> 6) + 1;
        __position._M_current = (shared_ptr<docopt::Pattern> *)((long)local_148 + 0x20);
        do {
          peVar11 = ((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)
                    &((pointer)((long)__position._M_current + -0x20))->_M_dataplus)->_M_ptr;
          if ((peVar11 != (element_type *)0x0) &&
             (lVar6 = __dynamic_cast(peVar11,&Pattern::typeinfo,&typeinfo,0), lVar6 != 0)) {
            __position._M_current =
                 (shared_ptr<docopt::Pattern> *)((long)__position._M_current + -0x20);
            goto LAB_0013f2e2;
          }
          peVar11 = (element_type *)
                    (((pointer)((long)__position._M_current + -0x20))->field_2).
                    _M_allocated_capacity;
          if ((peVar11 != (element_type *)0x0) &&
             (lVar6 = __dynamic_cast(peVar11,&Pattern::typeinfo,&typeinfo,0), lVar6 != 0)) {
            __position._M_current =
                 (shared_ptr<docopt::Pattern> *)
                 &((pointer)((long)__position._M_current + -0x20))->field_2;
            goto LAB_0013f2e2;
          }
          peVar11 = ((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)
                    &((pointer)__position._M_current)->_M_dataplus)->_M_ptr;
          if ((peVar11 != (element_type *)0x0) &&
             (lVar6 = __dynamic_cast(peVar11,&Pattern::typeinfo,&typeinfo,0), lVar6 != 0))
          goto LAB_0013f2e2;
          peVar11 = (element_type *)
                    (((pointer)__position._M_current)->field_2)._M_allocated_capacity;
          if ((peVar11 != (element_type *)0x0) &&
             (lVar6 = __dynamic_cast(peVar11,&Pattern::typeinfo,&typeinfo,0), lVar6 != 0)) {
            __position._M_current =
                 (shared_ptr<docopt::Pattern> *)&((pointer)__position._M_current)->field_2;
            goto LAB_0013f2e2;
          }
          lVar13 = lVar13 + -1;
          __position._M_current =
               (shared_ptr<docopt::Pattern> *)((long)__position._M_current + 0x40);
        } while (1 < lVar13);
        uVar5 = uVar2 - (long)pbVar8;
        __position._M_current = (shared_ptr<docopt::Pattern> *)pbVar8;
      }
      lVar13 = (long)uVar5 >> 4;
      if (lVar13 == 1) {
LAB_0013f29d:
        peVar11 = ((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)
                  &((pointer)__position._M_current)->_M_dataplus)->_M_ptr;
        if ((peVar11 != (element_type *)0x0) &&
           (lVar13 = __dynamic_cast(peVar11,&Pattern::typeinfo,&typeinfo,0), lVar13 != 0))
        goto LAB_0013f2e2;
LAB_0013f3c7:
        std::
        vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
        ::
        emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                  ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                    *)&local_98,
                   (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)local_148);
      }
      else {
        if (lVar13 == 2) {
LAB_0013f278:
          peVar11 = ((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)
                    &((pointer)__position._M_current)->_M_dataplus)->_M_ptr;
          if ((peVar11 == (element_type *)0x0) ||
             (lVar13 = __dynamic_cast(peVar11,&Pattern::typeinfo,&typeinfo,0), lVar13 == 0)) {
            __position._M_current =
                 (shared_ptr<docopt::Pattern> *)&((pointer)__position._M_current)->field_2;
            goto LAB_0013f29d;
          }
        }
        else {
          if (lVar13 != 3) goto LAB_0013f3c7;
          peVar11 = ((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)
                    &((pointer)__position._M_current)->_M_dataplus)->_M_ptr;
          if ((peVar11 == (element_type *)0x0) ||
             (lVar13 = __dynamic_cast(peVar11,&Pattern::typeinfo,&typeinfo,0), lVar13 == 0)) {
            __position._M_current =
                 (shared_ptr<docopt::Pattern> *)&((pointer)__position._M_current)->field_2;
            goto LAB_0013f278;
          }
        }
LAB_0013f2e2:
        if (__position._M_current == (shared_ptr<docopt::Pattern> *)uVar2) goto LAB_0013f3c7;
        this_00 = ((__position._M_current)->
                  super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
        ;
        ((__position._M_current)->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = (element_type *)0x0;
        ((__position._M_current)->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::_M_erase((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)local_148,__position);
        lVar13 = __dynamic_cast(peVar11,&Pattern::typeinfo,&Either::typeinfo,0);
        if (lVar13 == 0) {
          lVar13 = __dynamic_cast(peVar11,&Pattern::typeinfo,&OneOrMore::typeinfo,0);
          if (lVar13 == 0) {
            lVar13 = __dynamic_cast(peVar11,&Pattern::typeinfo,&typeinfo,0);
            std::
            vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)&local_118,
                     (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)(lVar13 + 8));
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                      ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                        *)&local_118,
                       local_118.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_148,auStack_140._0_8_);
            std::
            vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
            ::
            emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                      ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                        *)&local_d8,
                       (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        *)&local_118);
          }
          else {
            std::
            vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)&local_118,
                     (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)(lVar13 + 8));
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                      ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                        *)&local_118,
                       local_118.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(lVar13 + 8),
                       *(undefined8 *)(lVar13 + 0x10));
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                      ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                        *)&local_118,
                       local_118.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_148,auStack_140._0_8_);
            std::
            vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
            ::
            emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                      ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                        *)&local_d8,
                       (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        *)&local_118);
          }
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)&local_118);
        }
        else {
          puVar1 = *(undefined8 **)(lVar13 + 0x10);
          for (puVar9 = *(undefined8 **)(lVar13 + 8); puVar9 != puVar1; puVar9 = puVar9 + 2) {
            local_f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar9;
            local_f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar9[1];
            if (local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&(local_f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length =
                     (int)(local_f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length + 1;
                UNLOCK();
              }
              else {
                *(int *)&(local_f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length =
                     (int)(local_f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length + 1;
              }
            }
            __l._M_len = 1;
            __l._M_array = (iterator)&local_f8;
            std::
            vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)&local_118,__l,&local_149);
            if (local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_f8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                      ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                        *)&local_118,
                       local_118.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_148,auStack_140._0_8_);
            std::
            vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
            ::
            emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                      ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                        *)&local_d8,
                       (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        *)&local_118);
            std::
            vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       *)&local_118);
          }
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)local_148);
    } while (local_d8._M_buckets != (__buckets_ptr)local_d8._M_bucket_count);
  }
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ::~vector((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             *)&local_d8);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector(&local_48);
  pvVar3 = local_98.
           super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_58 = (_func_int **)&PTR_flat_001500d8;
    pvVar12 = local_98.
              super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      _Hashtable<std::shared_ptr<docopt::Pattern>,std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<docopt::Pattern>>,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,false>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                ((_Hashtable<std::shared_ptr<docopt::Pattern>,std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<docopt::Pattern>>,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,false>>
                  *)&local_d8,
                 (pvVar12->
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (pvVar12->
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,0,local_148,&local_118,&local_f8);
      for (_Var10._M_nxt = local_d8._M_before_begin._M_nxt; _Var10._M_nxt != (_Hash_node_base *)0x0;
          _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt) {
        sVar7 = std::
                _Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                ::count(&local_d8,(key_type *)(_Var10._M_nxt + 1));
        if (((sVar7 != 1) &&
            (peVar11 = (((key_type *)(_Var10._M_nxt + 1))->
                       super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
            peVar11 != (element_type *)0x0)) &&
           (this_01 = (LeafPattern *)
                      __dynamic_cast(peVar11,&Pattern::typeinfo,&LeafPattern::typeinfo),
           this_01 != (LeafPattern *)0x0)) {
          lVar13 = __dynamic_cast(this_01,&LeafPattern::typeinfo,&Command::typeinfo);
          if (lVar13 == 0) {
            lVar13 = __dynamic_cast(this_01,&LeafPattern::typeinfo,&Argument::typeinfo);
            if (lVar13 == 0) {
              if ((this_01->super_Pattern)._vptr_Pattern != local_58) goto LAB_0013f7ad;
              if (*(int *)((long)&this_01[1].fValue.variant + 0x10) == 0) goto LAB_0013f5b7;
            }
            local_118.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_118.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_118.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            KVar4 = (this_01->fValue).kind;
            if (KVar4 == String) {
              local_50 = pvVar12;
              value::throwIfNotKind(&this_01->fValue,String);
              anon_unknown.dwarf_57304::split(&local_f8,&(this_01->fValue).variant.strValue,0);
              auStack_140._8_8_ =
                   local_118.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              auStack_140._0_8_ =
                   local_118.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_148 = (undefined1  [8])
                          local_118.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_148);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_f8);
              KVar4 = (this_01->fValue).kind;
              pvVar12 = local_50;
            }
            if (KVar4 != StringList) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_78,&local_118);
              local_148._0_4_ = 4;
              auStack_140._0_8_ =
                   local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              auStack_140._8_8_ =
                   local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              auStack_140._16_8_ =
                   local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              LeafPattern::setValue(this_01,(value *)local_148);
              if (local_148._0_4_ == StringList) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_140);
              }
              else if ((local_148._0_4_ == String) &&
                      ((pointer)auStack_140._0_8_ != (pointer)(auStack_140 + 0x10))) {
                operator_delete((void *)auStack_140._0_8_,
                                (ulong)((long)&((_Alloc_hider *)auStack_140._16_8_)->_M_p + 1));
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_78);
            }
            this_02 = &local_118;
          }
          else {
LAB_0013f5b7:
            local_148._0_4_ = 2;
            auStack_140._0_8_ = (pointer)0x0;
            LeafPattern::setValue(this_01,(value *)local_148);
            if (local_148._0_4_ != StringList) {
              if ((local_148._0_4_ == String) &&
                 ((pointer)auStack_140._0_8_ != (pointer)(auStack_140 + 0x10))) {
                operator_delete((void *)auStack_140._0_8_,
                                (ulong)((long)&((_Alloc_hider *)auStack_140._16_8_)->_M_p + 1));
              }
              goto LAB_0013f7ad;
            }
            this_02 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_140;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_02);
        }
LAB_0013f7ad:
      }
      std::
      _Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
      ::~_Hashtable(&local_d8);
      pvVar12 = pvVar12 + 1;
    } while (pvVar12 != pvVar3);
  }
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

PatternList const& children() const { return fChildren; }